

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

void __thiscall Fl_Preferences::~Fl_Preferences(Fl_Preferences *this)

{
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

Fl_Preferences::~Fl_Preferences() {
  if (node && !node->parent()) delete rootNode;
  // DO NOT delete nodes! The root node will do that after writing the preferences
  // zero all pointer to avoid memory errors, even though
  // Valgrind does not complain (Cygwin does though)
  node = 0L;
  rootNode = 0L;
}